

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

QColor QColorDialog::getColor
                 (QColor *initial,QWidget *parent,QString *title,ColorDialogOptions options)

{
  undefined8 uVar1;
  bool bVar2;
  QColorDialog *this;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QColor QVar4;
  QAutoPointer<QColorDialog> local_58;
  undefined4 local_48;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined4 local_40;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QColorDialog *)operator_new(0x28);
  QColorDialog(this,parent);
  QPointer<QColorDialog>::QPointer<void>(&local_58.o,this);
  if ((title->d).size != 0) {
    QWidget::setWindowTitle((QWidget *)local_58.o.wp.value,title);
  }
  setOptions((QColorDialog *)local_58.o.wp.value,options);
  setCurrentColor((QColorDialog *)local_58.o.wp.value,initial);
  (**(code **)(*(long *)local_58.o.wp.value + 0x1a8))();
  bVar2 = QAutoPointer::operator_cast_to_bool((QAutoPointer *)&local_58);
  if (bVar2) {
    uVar3 = *(undefined8 *)(*(long *)((long)local_58.o.wp.value + 8) + 0x350);
    uVar1 = *(undefined8 *)(*(long *)((long)local_58.o.wp.value + 8) + 0x358);
    local_40 = (undefined4)uVar1;
    uStack_3c = (undefined2)((ulong)uVar1 >> 0x20);
  }
  else {
    local_48 = 0;
    uStack_44 = 0xffff;
    uStack_42 = 0;
    local_40 = 0;
    uStack_3c = 0;
    uVar3 = 0xffff00000000;
  }
  QAutoPointer<QColorDialog>::~QAutoPointer(&local_58);
  QVar4.ct.argb.pad = uStack_3c;
  QVar4.ct._4_4_ = local_40;
  QVar4._14_2_ = uStack_3a;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar4._0_8_ = uVar3;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QColor QColorDialog::getColor(const QColor &initial, QWidget *parent, const QString &title,
                              ColorDialogOptions options)
{
    QAutoPointer<QColorDialog> dlg(new QColorDialog(parent));
    if (!title.isEmpty())
        dlg->setWindowTitle(title);
    dlg->setOptions(options);
    dlg->setCurrentColor(initial);

    // If the dlg was deleted with a parent window,
    // dlg == nullptr after leaving the exec().
    dlg->exec();
    if (bool(dlg))
        return dlg->selectedColor();
    else
        return QColor();
}